

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::remove_last(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
              *this)

{
  if ((this->nextIndex_ != 0) && ((this->matrix_)._M_h._M_element_count != 0)) {
    _remove_last(this,this->nextIndex_ - 1);
    return;
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::remove_last()
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_last' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container || !Master_matrix::Option_list::has_vine_update,
                "'remove_last' is not implemented for the chosen options.");

  if (nextIndex_ == 0 || matrix_.empty()) return;  // empty matrix

  if constexpr (Master_matrix::Option_list::has_vine_update) {
    // careful: linear because of the search of the last index. It is better to keep track of the @ref IDIdx index
    // of the last column while performing swaps (or the @ref MatIdx with the return values of `vine_swap` + get_pivot)
    // and then call `remove_maximal_cell` with it and an empty `columnsToSwap`.

    ID_index pivot = 0;
    Index colIndex = 0;
    for (auto& p : pivotToColumnIndex_) {
      if (p.first > pivot) {  // pivots have to be strictly increasing in order of filtration
        pivot = p.first;
        colIndex = p.second;
      }
    }
    _remove_last(colIndex);
  } else {
    _remove_last(nextIndex_ - 1);
  }
}